

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O3

bool __thiscall
tinyusdz::ascii::AsciiParser::SepBy1BasicType<tinyusdz::Token>
          (AsciiParser *this,char sep,char end_symbol,
          vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *result)

{
  StreamReader *pSVar1;
  bool bVar2;
  ulong uVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  int iVar5;
  Token value;
  char c;
  string local_70;
  string local_50;
  
  ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::_M_erase_at_end
            (result,(result->super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>).
                    _M_impl.super__Vector_impl_data._M_start);
  bVar2 = SkipWhitespaceAndNewline(this,true);
  if (bVar2) {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    local_70._M_string_length = 0;
    local_70.field_2._M_local_buf[0] = '\0';
    bVar2 = ReadBasicType(this,(token *)&local_70);
    if (bVar2) {
      ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::push_back
                (result,(value_type *)&local_70);
    }
    else {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"Not starting with the value of requested type.\n","");
      PushError(this,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    }
    paVar4 = &local_70.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar4) {
      operator_delete(local_70._M_dataplus._M_p,
                      CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                               local_70.field_2._M_local_buf[0]) + 1);
    }
    if (bVar2) {
      do {
        pSVar1 = this->_sr;
        if ((pSVar1->length_ <= pSVar1->idx_) || (pSVar1->binary_[pSVar1->idx_] == '\0'))
        goto LAB_003e51b6;
        bVar2 = SkipCommentAndWhitespaceAndNewline(this,true);
        if (!bVar2) {
          return false;
        }
        bVar2 = Char1(this,(char *)&local_50);
        if (!bVar2) {
          return false;
        }
        if ((char)local_50._M_dataplus._M_p == sep) {
          bVar2 = SkipCommentAndWhitespaceAndNewline(this,true);
          if (!bVar2) {
            return false;
          }
          bVar2 = LookChar1(this,(char *)&local_70);
          if (!bVar2) {
            return false;
          }
          iVar5 = 3;
          if ((char)local_70._M_dataplus._M_p != end_symbol) {
            goto LAB_003e5125;
          }
        }
        else {
LAB_003e5125:
          if ((char)local_50._M_dataplus._M_p != sep) {
            pSVar1 = this->_sr;
            if ((0 < (long)pSVar1->idx_) && (uVar3 = pSVar1->idx_ - 1, uVar3 <= pSVar1->length_)) {
              pSVar1->idx_ = uVar3;
            }
            goto LAB_003e51b6;
          }
          bVar2 = SkipWhitespaceAndNewline(this,true);
          if (!bVar2) {
            return false;
          }
          local_70._M_string_length = 0;
          local_70.field_2._M_local_buf[0] = '\0';
          local_70._M_dataplus._M_p = (pointer)paVar4;
          bVar2 = ReadBasicType(this,(token *)&local_70);
          iVar5 = 3;
          if (bVar2) {
            ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::push_back
                      (result,(value_type *)&local_70);
            iVar5 = 0;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != paVar4) {
            operator_delete(local_70._M_dataplus._M_p,
                            CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                                     local_70.field_2._M_local_buf[0]) + 1);
          }
        }
      } while (iVar5 == 0);
      if (iVar5 != 1) {
LAB_003e51b6:
        if ((result->super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>)._M_impl.
            super__Vector_impl_data._M_start !=
            (result->super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>)._M_impl.
            super__Vector_impl_data._M_finish) {
          return true;
        }
        local_70._M_dataplus._M_p = (pointer)paVar4;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"Empty array.\n","");
        PushError(this,&local_70);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != paVar4) {
          operator_delete(local_70._M_dataplus._M_p,
                          CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                                   local_70.field_2._M_local_buf[0]) + 1);
        }
      }
    }
  }
  return false;
}

Assistant:

bool AsciiParser::SepBy1BasicType(const char sep, const char end_symbol, std::vector<T> *result) {
  result->clear();

  if (!SkipWhitespaceAndNewline()) {
    return false;
  }

  {
    T value;
    if (!ReadBasicType(&value)) {
      PushError("Not starting with the value of requested type.\n");
      return false;
    }

    result->push_back(value);
  }

  while (!Eof()) {
    if (!SkipCommentAndWhitespaceAndNewline()) {
      return false;
    }

    // sep
    char c;
    if (!Char1(&c)) {
      return false;
    }

    if (c == sep) {
      // Look next token
      if (!SkipCommentAndWhitespaceAndNewline()) {
        return false;
      }

      char nc;
      if (!LookChar1(&nc)) {
        return false;
      }

      if (nc == end_symbol) {
        // end
        break;
      }
    }

    if (c != sep) {
      // end
      _sr->seek_from_current(-1);  // unwind single char
      break;
    }

    if (!SkipWhitespaceAndNewline()) {
      return false;
    }

    T value;
    if (!ReadBasicType(&value)) {
      break;
    }

    result->push_back(value);


  }

  if (result->empty()) {
    PushError("Empty array.\n");
    return false;
  }

  return true;
}